

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O1

void emit_mrm(ASMState *as,x86Op xo,Reg rr,Reg rb)

{
  byte bVar1;
  byte *pbVar2;
  MCode *pMVar3;
  uint uVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  
  pMVar3 = as->mcp;
  cVar6 = -0x40;
  bVar5 = (byte)(rr >> 0x10);
  if (rb == 0x20) {
    bVar1 = (as->mrm).base;
    uVar4 = (uint)bVar1;
    if (bVar1 == 0x25) {
      *(int32_t *)(pMVar3 + -4) = (as->mrm).ofs;
      pMVar3 = pMVar3 + -4;
      cVar6 = '\0';
      rb = 0x25;
      goto LAB_0013f4cf;
    }
    if (bVar1 == 0x80) {
      *(int32_t *)(pMVar3 + -4) = (as->mrm).ofs;
      cVar6 = '\0';
      pMVar3 = pMVar3 + -4;
      uVar4 = 5;
    }
    else {
      iVar7 = (as->mrm).ofs;
      cVar6 = '\0';
      if ((uVar4 & 7) == 5 || iVar7 != 0) {
        if ((char)(MCode)iVar7 == iVar7) {
          pMVar3[-1] = (MCode)iVar7;
          pMVar3 = pMVar3 + -1;
          cVar6 = '@';
        }
        else {
          *(int *)(pMVar3 + -4) = iVar7;
          pMVar3 = pMVar3 + -4;
          cVar6 = -0x80;
        }
      }
    }
    pMVar3[-1] = ((byte)uVar4 & 7) + (as->mrm).scale + ((as->mrm).idx & 7) * '\b';
    pMVar3[-2] = cVar6 + ((byte)rr & 7) * '\b' + '\x04';
    bVar1 = (as->mrm).idx;
    iVar7 = xo << 0x18;
    if (iVar7 == -0x3c000000) {
      *(x86Op *)(pMVar3 + -6) = (uVar4 >> 3 & 1 | bVar1 >> 2 & 2 | rr >> 1 & 4) << 0xd ^ xo;
      pbVar2 = pMVar3 + -6;
      goto LAB_0013f6b5;
    }
    *(x86Op *)(pMVar3 + -6) = xo;
    pbVar2 = pMVar3 + (long)(iVar7 >> 0x18) + -1;
    uVar4 = uVar4 >> 3 & 1 | rr >> 1 & 0x104 | bVar1 >> 2 & 2;
    if (uVar4 == 0) goto LAB_0013f6b5;
    bVar5 = bVar5 | (byte)uVar4 | 0x40;
    if (iVar7 != -0x4000000) goto LAB_0013f698;
LAB_0013f555:
    *pbVar2 = bVar5;
    bVar5 = (byte)(xo >> 8);
  }
  else {
LAB_0013f4cf:
    pMVar3[-1] = ((byte)rb & 7) + ((byte)rr & 7) * '\b' + cVar6;
    iVar7 = xo << 0x18;
    if (iVar7 == -0x3c000000) {
      *(x86Op *)(pMVar3 + -5) = (rb >> 3 & 1 | rr >> 1 & 4) << 0xd ^ xo;
      pbVar2 = pMVar3 + -5;
      goto LAB_0013f6b5;
    }
    *(x86Op *)(pMVar3 + -5) = xo;
    pbVar2 = pMVar3 + (iVar7 >> 0x18);
    uVar4 = rb >> 3 & 1 | rr >> 1 & 0x104;
    if (uVar4 == 0) goto LAB_0013f6b5;
    bVar5 = bVar5 | (byte)uVar4 | 0x40;
    if (iVar7 == -0x4000000) goto LAB_0013f555;
LAB_0013f698:
    if ((xo & 0xffffff) == 0x6600fd) {
      *pbVar2 = bVar5;
      bVar5 = 0x66;
    }
  }
  pbVar2[-1] = bVar5;
  pbVar2 = pbVar2 + -1;
LAB_0013f6b5:
  as->mcp = pbVar2;
  return;
}

Assistant:

static void emit_mrm(ASMState *as, x86Op xo, Reg rr, Reg rb)
{
  MCode *p = as->mcp;
  x86Mode mode = XM_REG;
  if (rb == RID_MRM) {
    rb = as->mrm.base;
    if (rb == RID_NONE) {
      rb = RID_EBP;
      mode = XM_OFS0;
      p -= 4;
      *(int32_t *)p = as->mrm.ofs;
      if (as->mrm.idx != RID_NONE)
	goto mrmidx;
#if LJ_64
      *--p = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
      rb = RID_ESP;
#endif
    } else if (LJ_GC64 && rb == RID_RIP) {
      lj_assertA(as->mrm.idx == RID_NONE, "RIP-rel mrm cannot have index");
      mode = XM_OFS0;
      p -= 4;
      *(int32_t *)p = as->mrm.ofs;
    } else {
      if (as->mrm.ofs == 0 && (rb&7) != RID_EBP) {
	mode = XM_OFS0;
      } else if (checki8(as->mrm.ofs)) {
	*--p = (MCode)as->mrm.ofs;
	mode = XM_OFS8;
      } else {
	p -= 4;
	*(int32_t *)p = as->mrm.ofs;
	mode = XM_OFS32;
      }
      if (as->mrm.idx != RID_NONE) {
      mrmidx:
	as->mcp = emit_opmx(xo, mode, as->mrm.scale, rr, rb, as->mrm.idx, p);
	return;
      }
      if ((rb&7) == RID_ESP)
	*--p = MODRM(XM_SCALE1, RID_ESP, RID_ESP);
    }
  }
  as->mcp = emit_opm(xo, mode, rr, rb, p, 0);
}